

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setDate(QDateTimeEdit *this,QDate date)

{
  QDateTimeEditPrivate *this_00;
  undefined4 uVar1;
  long in_FS_OFFSET;
  QDateTime when;
  undefined1 *local_48;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
    this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    if (((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
         super_QFlagsStorage<QDateTimeEdit::Section>.i & 0x700) == 0) {
      setDateRange(this,date,date);
    }
    (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xf8))
              (this_00);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    uVar1 = ::QVariant::toTime();
    QDateTime::QDateTime((QDateTime *)&local_48,date.jd,uVar1,&this_00->timeZone,1);
    ::QVariant::QVariant(&local_40,(QDateTime *)&local_48);
    QAbstractSpinBoxPrivate::setValue
              (&this_00->super_QAbstractSpinBoxPrivate,&local_40,EmitIfChanged,true);
    ::QVariant::~QVariant(&local_40);
    QDateTimeEditPrivate::updateTimeZone(this_00);
    QDateTime::~QDateTime((QDateTime *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDate(QDate date)
{
    Q_D(QDateTimeEdit);
    if (date.isValid()) {
        if (!(d->sections & DateSections_Mask))
            setDateRange(date, date);

        d->clearCache();
        QDateTime when = d->dateTimeValue(date, d->value.toTime());
        Q_ASSERT(when.isValid());
        d->setValue(when, EmitIfChanged);
        d->updateTimeZone();
    }
}